

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O2

pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,int,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_int> *data,int *row,int *column,
          double *value)

{
  uint uVar1;
  int *piVar2;
  const_iterator __position;
  value_type_conflict1 *__x;
  int iVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  undefined **local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
  *local_40;
  value_type_conflict1 *local_38;
  
  uVar1 = *(uint *)&(data->row_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  piVar10 = (int *)(ulong)uVar1;
  if ((int)uVar1 < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
    local_68 = &PTR_s__workspace_llm4binary_github_lic_001555f8;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_68,(source_location *)row);
    poVar5 = std::operator<<(poVar5,(string *)&local_60);
    poVar5 = std::operator<<(poVar5,"Row index must be positive.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    iVar3 = *row;
    if (-1 < iVar3) {
      lVar11 = *(long *)this;
      iVar9 = 0;
      if (*(long *)(this + 8) != lVar11) {
        iVar9 = (int)((ulong)(*(long *)(this + 8) - lVar11) >> 2) + -1;
      }
      local_40 = __return_storage_ptr__;
      if (iVar9 <= (int)uVar1) {
        local_60._M_dataplus._M_p._0_4_ = uVar1 + 1;
        piVar10 = (int *)(ulong)(uint)local_60._M_dataplus._M_p;
        local_68 = (undefined **)CONCAT44(local_68._4_4_,*(undefined4 *)(this + 0x48));
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_68);
        iVar3 = *row;
        lVar11 = *(long *)this;
      }
      local_38 = (value_type_conflict1 *)column;
      if (*(int *)(this + 0x48) <= iVar3) {
        local_60._M_dataplus._M_p._0_4_ = 0;
        if (*(long *)(this + 8) != lVar11) {
          local_60._M_dataplus._M_p._0_4_ = (int)((ulong)(*(long *)(this + 8) - lVar11) >> 2) - 1;
        }
        local_68 = (undefined **)CONCAT44(local_68._4_4_,iVar3 + 1);
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_68);
        lVar11 = *(long *)this;
      }
      lVar7 = (long)*(int *)&(data->row_offset).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start;
      uVar6 = lVar11 + lVar7 * 4;
      lower_bound<double,int,int>((type *)&local_60,this,data,row,piVar10);
      __x = local_38;
      if ((local_60.field_2._M_allocated_capacity == uVar6) &&
         (*(int *)local_60._M_string_length == *row)) {
        _Var4._M_current =
             (double *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(uint)local_60._M_dataplus._M_p);
        bVar8 = false;
        uVar6 = local_60.field_2._M_allocated_capacity;
      }
      else {
        piVar2 = *(int **)(this + 8);
        piVar10 = (int *)(lVar11 + lVar7 * 4);
        while (piVar10 = piVar10 + 1, piVar10 < piVar2) {
          *piVar10 = *piVar10 + 1;
        }
        local_60._M_string_length =
             (size_type)
             std::vector<int,_std::allocator<int>_>::insert
                       ((vector<int,_std::allocator<int>_> *)(this + 0x18),
                        (const_iterator)local_60._M_string_length,row);
        __position._M_current._4_4_ = local_60._M_dataplus._M_p._4_4_;
        __position._M_current._0_4_ = (uint)local_60._M_dataplus._M_p;
        _Var4._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::insert
                       ((vector<double,_std::allocator<double>_> *)(this + 0x30),__position,__x);
        bVar8 = true;
      }
      (local_40->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
      ._M_head_impl._M_current = _Var4._M_current;
      (local_40->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)local_60._M_string_length;
      (local_40->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)uVar6;
      local_40->second = bVar8;
      return local_40;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
    local_68 = &PTR_s__workspace_llm4binary_github_lic_00155610;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_68,(source_location *)row);
    poVar5 = std::operator<<(poVar5,(string *)&local_60);
    poVar5 = std::operator<<(poVar5,"Columns index must be positive.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::~string((string *)&local_60);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}